

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void __thiscall google::LogMessage::SaveOrSendToLog(LogMessage *this)

{
  ulong uVar1;
  long in_RDI;
  LogMessage *in_stack_00000010;
  int len;
  char *start;
  value_type *__x;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  allocator local_39;
  string local_38 [36];
  int local_14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_10;
  
  if (*(long *)(*(long *)(in_RDI + 8) + 0x76b0) == 0) {
    SendToLog(in_stack_00000010);
  }
  else {
    this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(*(long *)(in_RDI + 8) + 4 + *(long *)(*(long *)(in_RDI + 8) + 0x7700));
    local_14 = ~*(uint *)(*(long *)(in_RDI + 8) + 0x7700) + *(int *)(*(long *)(in_RDI + 8) + 0x7708)
    ;
    __x = *(value_type **)(*(long *)(in_RDI + 8) + 0x76b0);
    uVar1 = (ulong)local_14;
    local_10 = this_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,(char *)this_00,uVar1,&local_39);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this_00,__x);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(log_mutex) {
  if (data_->outvec_ != NULL) {
    RAW_DCHECK(data_->num_chars_to_log_ > 0 &&
               data_->message_text_[data_->num_chars_to_log_-1] == '\n', "");
    // Omit prefix of message and trailing newline when recording in outvec_.
    const char *start = data_->message_text_ + data_->num_prefix_chars_;
    int len = data_->num_chars_to_log_ - data_->num_prefix_chars_ - 1;
    data_->outvec_->push_back(string(start, len));
  } else {
    SendToLog();
  }
}